

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

void * rw::destroySkin(void *object,int32 offset,int32 param_3)

{
  long lVar1;
  Skin *skin;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  lVar1 = *(long *)((long)object + (long)offset);
  if (lVar1 != 0) {
    (*DAT_00168638)(*(undefined8 *)(lVar1 + 0x58));
    (*DAT_00168638)(*(undefined8 *)(lVar1 + 0x40));
  }
  (*DAT_00168638)(lVar1);
  return object;
}

Assistant:

static void*
destroySkin(void *object, int32 offset, int32)
{
	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	if(skin){
		rwFree(skin->data);
		rwFree(skin->remapIndices);
//		delete[] skin->platformData;
	}
	rwFree(skin);
	return object;
}